

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O0

uint32_t __thiscall
icu_63::CollationDataBuilder::encodeExpansion32
          (CollationDataBuilder *this,int32_t *newCE32s,int32_t length,UErrorCode *errorCode)

{
  int iVar1;
  UBool UVar2;
  int32_t iVar3;
  int32_t iVar4;
  uint32_t uVar5;
  int local_48;
  int32_t j_1;
  int32_t i;
  int32_t j;
  int32_t i_1;
  int32_t ce32sMax;
  int32_t first;
  UErrorCode *errorCode_local;
  int32_t length_local;
  int32_t *newCE32s_local;
  CollationDataBuilder *this_local;
  
  UVar2 = ::U_FAILURE(*errorCode);
  if (UVar2 == '\0') {
    iVar1 = *newCE32s;
    iVar3 = UVector32::size(&this->ce32s);
    for (i = 0; i <= iVar3 - length; i = i + 1) {
      iVar4 = UVector32::elementAti(&this->ce32s,i);
      if (iVar1 == iVar4) {
        if (0x7ffff < i) {
          *errorCode = U_BUFFER_OVERFLOW_ERROR;
          return 0;
        }
        j_1 = 1;
        while( true ) {
          if (j_1 == length) {
            uVar5 = Collation::makeCE32FromTagIndexAndLength(5,i,length);
            return uVar5;
          }
          iVar4 = UVector32::elementAti(&this->ce32s,i + j_1);
          if (iVar4 != newCE32s[j_1]) break;
          j_1 = j_1 + 1;
        }
      }
    }
    iVar3 = UVector32::size(&this->ce32s);
    if (iVar3 < 0x80000) {
      for (local_48 = 0; local_48 < length; local_48 = local_48 + 1) {
        UVector32::addElement(&this->ce32s,newCE32s[local_48],errorCode);
      }
      this_local._4_4_ = Collation::makeCE32FromTagIndexAndLength(5,iVar3,length);
    }
    else {
      *errorCode = U_BUFFER_OVERFLOW_ERROR;
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t
CollationDataBuilder::encodeExpansion32(const int32_t newCE32s[], int32_t length,
                                        UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    // See if this sequence of CE32s has already been stored.
    int32_t first = newCE32s[0];
    int32_t ce32sMax = ce32s.size() - length;
    for(int32_t i = 0; i <= ce32sMax; ++i) {
        if(first == ce32s.elementAti(i)) {
            if(i > Collation::MAX_INDEX) {
                errorCode = U_BUFFER_OVERFLOW_ERROR;
                return 0;
            }
            for(int32_t j = 1;; ++j) {
                if(j == length) {
                    return Collation::makeCE32FromTagIndexAndLength(
                            Collation::EXPANSION32_TAG, i, length);
                }
                if(ce32s.elementAti(i + j) != newCE32s[j]) { break; }
            }
        }
    }
    // Store the new sequence.
    int32_t i = ce32s.size();
    if(i > Collation::MAX_INDEX) {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return 0;
    }
    for(int32_t j = 0; j < length; ++j) {
        ce32s.addElement(newCE32s[j], errorCode);
    }
    return Collation::makeCE32FromTagIndexAndLength(Collation::EXPANSION32_TAG, i, length);
}